

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O2

SpatialMotionVector * iDynTree::getRandomTwist(void)

{
  double dVar1;
  SpatialMotionVector *in_RDI;
  long lVar2;
  
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[1] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[2] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[2] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[0] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[0] =
       0.0;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[1] =
       0.0;
  for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 8) {
    dVar1 = getRandomDouble(0.0,1.0);
    *(double *)
     ((long)(in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
            m_data + lVar2) = dVar1;
    dVar1 = getRandomDouble(0.0,1.0);
    *(double *)
     ((long)in_RDI[1].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
            m_data + lVar2) = dVar1;
  }
  return in_RDI;
}

Assistant:

SpatialMotionVector getRandomTwist()
{
    SpatialMotionVector ret;

    for(int i=0; i < 3; i++ )
    {
        ret.getLinearVec3()(i) = getRandomDouble();
        ret.getAngularVec3()(i) = getRandomDouble();
    }

    return ret;
}